

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O2

void cmQtAutoGeneratorInitializer::SetupAutoGenerateTarget(cmGeneratorTarget *target)

{
  cmMakefile *this;
  cmMakefile *pcVar1;
  cmSourceFile *pcVar2;
  _Alloc_hider infile;
  _Alloc_hider outfile;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  FileFormat FVar6;
  string *psVar7;
  char *pcVar8;
  char *pcVar9;
  cmLocalGenerator *pcVar10;
  mapped_type *pmVar11;
  cmGeneratorTarget *pcVar12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var13;
  char **ppcVar14;
  ostream *poVar15;
  _Base_ptr p_Var16;
  pointer pbVar17;
  pointer pbVar18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer ppcVar19;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar20;
  string inputFile;
  string opts;
  mode_t perm;
  size_type local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  string rcc_output_dir;
  string outputFile;
  string config_moc_compile_defs;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcFiles;
  allocator local_409;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newRccFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rccOptions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configIncludes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs_1;
  ScopePushPop varScope;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  skipUic;
  string absFile;
  size_type *local_308;
  undefined8 local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mocHeaders;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mocSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  skipMoc;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configDefines;
  string autogenTargetName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configUicOptions;
  string targetDir;
  
  this = target->Target->Makefile;
  varScope.Makefile = this;
  cmMakefile::PushScope(this);
  GetAutogenTargetName_abi_cxx11_(&autogenTargetName,target);
  std::__cxx11::string::string((string *)&absFile,"_moc_target_name",(allocator *)&configDefines);
  cmOutputConverter::EscapeForCMake((string *)&configIncludes,&autogenTargetName);
  cmMakefile::AddDefinition(this,&absFile,(char *)configIncludes._M_t._M_impl._0_8_);
  std::__cxx11::string::~string((string *)&configIncludes);
  std::__cxx11::string::~string((string *)&absFile);
  std::__cxx11::string::string((string *)&absFile,"_origin_target_name",(allocator *)&configDefines)
  ;
  psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  cmOutputConverter::EscapeForCMake((string *)&configIncludes,psVar7);
  cmMakefile::AddDefinition(this,&absFile,(char *)configIncludes._M_t._M_impl._0_8_);
  std::__cxx11::string::~string((string *)&configIncludes);
  std::__cxx11::string::~string((string *)&absFile);
  GetAutogenTargetDir_abi_cxx11_(&targetDir,target);
  std::__cxx11::string::string
            ((string *)&absFile,"Qt5Core_VERSION_MAJOR",(allocator *)&configIncludes);
  pcVar8 = cmMakefile::GetDefinition(this,&absFile);
  std::__cxx11::string::~string((string *)&absFile);
  if (pcVar8 == (char *)0x0) {
    std::__cxx11::string::string((string *)&absFile,"QT_VERSION_MAJOR",(allocator *)&configIncludes)
    ;
    pcVar8 = cmMakefile::GetDefinition(this,&absFile);
    std::__cxx11::string::~string((string *)&absFile);
  }
  std::__cxx11::string::string((string *)&absFile,"QT_MAJOR_VERSION",(allocator *)&configDefines);
  std::__cxx11::string::string((string *)&configIncludes,"",(allocator *)&configUicOptions);
  pcVar9 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty
                     (target,&absFile,(string *)&configIncludes);
  std::__cxx11::string::~string((string *)&configIncludes);
  std::__cxx11::string::~string((string *)&absFile);
  if (pcVar9 != (char *)0x0) {
    pcVar8 = pcVar9;
  }
  if (pcVar8 != (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&absFile,"_target_qt_version",(allocator *)&configIncludes);
    cmMakefile::AddDefinition(this,&absFile,pcVar8);
    std::__cxx11::string::~string((string *)&absFile);
  }
  skipUic.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  skipUic.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  skipUic.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  skipMoc.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  skipMoc.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  skipMoc.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mocSources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mocSources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mocSources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mocHeaders.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mocHeaders.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mocHeaders.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  configIncludes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &configIncludes._M_t._M_impl.super__Rb_tree_header._M_header;
  configIncludes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  configIncludes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  configIncludes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  configDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &configDefines._M_t._M_impl.super__Rb_tree_header._M_header;
  configDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  configDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  configDefines._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header;
  configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  configUicOptions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  configIncludes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       configIncludes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  configDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       configDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&absFile,"AUTOMOC",(allocator *)&rcc_output_dir);
  bVar3 = cmGeneratorTarget::GetPropertyAsBool(target,&absFile);
  if (bVar3) {
LAB_003b2c3d:
    std::__cxx11::string::~string((string *)&absFile);
LAB_003b2c4a:
    pcVar1 = target->Target->Makefile;
    srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmGeneratorTarget::GetConfigCommonSourceFiles(target,&srcFiles);
    newRccFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    newRccFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    newRccFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (ppcVar19 = srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        psVar7 = newRccFiles.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        ppcVar19 !=
        srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar19 = ppcVar19 + 1) {
      pcVar2 = *ppcVar19;
      psVar7 = cmSourceFile::GetFullPath(pcVar2,(string *)0x0);
      cmsys::SystemTools::GetRealPath(&absFile,psVar7,(string *)0x0);
      std::__cxx11::string::string((string *)&inputFile,"SKIP_AUTOMOC",(allocator *)&outputFile);
      pcVar8 = cmSourceFile::GetPropertyForUser(pcVar2,&inputFile);
      bVar3 = cmSystemTools::IsOn(pcVar8);
      std::__cxx11::string::~string((string *)&inputFile);
      std::__cxx11::string::string((string *)&inputFile,"GENERATED",(allocator *)&outputFile);
      pcVar8 = cmSourceFile::GetPropertyForUser(pcVar2,&inputFile);
      bVar4 = cmSystemTools::IsOn(pcVar8);
      std::__cxx11::string::~string((string *)&inputFile);
      std::__cxx11::string::string((string *)&inputFile,"SKIP_AUTOUIC",(allocator *)&outputFile);
      pcVar8 = cmSourceFile::GetPropertyForUser(pcVar2,&inputFile);
      bVar5 = cmSystemTools::IsOn(pcVar8);
      std::__cxx11::string::~string((string *)&inputFile);
      if (bVar5) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&skipUic,&absFile);
      }
      psVar7 = cmSourceFile::GetExtension_abi_cxx11_(pcVar2);
      std::__cxx11::string::string((string *)&inputFile,(string *)psVar7);
      std::__cxx11::string::string((string *)&outputFile,"AUTORCC",(allocator *)&rcc_output_dir);
      bVar5 = cmGeneratorTarget::GetPropertyAsBool(target,&outputFile);
      std::__cxx11::string::~string((string *)&outputFile);
      if ((bVar5) && (bVar5 = std::operator==(&inputFile,"qrc"), bVar5)) {
        std::__cxx11::string::string
                  ((string *)&outputFile,"SKIP_AUTORCC",(allocator *)&rcc_output_dir);
        pcVar8 = cmSourceFile::GetPropertyForUser(pcVar2,&outputFile);
        bVar5 = cmSystemTools::IsOn(pcVar8);
        std::__cxx11::string::~string((string *)&outputFile);
        if (!bVar5) {
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&outputFile,&absFile);
          cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&rcc_output_dir,target);
          cmsys::SystemTools::MakeDirectory(rcc_output_dir._M_dataplus._M_p);
          std::__cxx11::string::string((string *)&perm,(string *)&rcc_output_dir);
          std::operator+(&opts,"/qrc_",&outputFile);
          std::operator+(&config_moc_compile_defs,&opts,".cpp");
          std::__cxx11::string::append((string *)&perm);
          std::__cxx11::string::~string((string *)&config_moc_compile_defs);
          std::__cxx11::string::~string((string *)&opts);
          std::__cxx11::string::string
                    ((string *)&config_moc_compile_defs,"ADDITIONAL_MAKE_CLEAN_FILES",
                     (allocator *)&opts);
          cmMakefile::AppendProperty(pcVar1,&config_moc_compile_defs,_perm,false);
          std::__cxx11::string::~string((string *)&config_moc_compile_defs);
          cmMakefile::GetOrCreateSource(pcVar1,(string *)&perm,true);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&newRccFiles,(string *)&perm);
          std::__cxx11::string::~string((string *)&perm);
          std::__cxx11::string::~string((string *)&rcc_output_dir);
          std::__cxx11::string::~string((string *)&outputFile);
        }
      }
      if (!bVar4) {
        if (bVar3) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&skipMoc,&absFile);
        }
        else {
          FVar6 = cmSystemTools::GetFileFormat(inputFile._M_dataplus._M_p);
          this_00 = &mocHeaders;
          if (FVar6 != HEADER_FILE_FORMAT) {
            if (FVar6 != CXX_FILE_FORMAT) goto LAB_003b2f7d;
            this_00 = &mocSources;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this_00,&absFile);
        }
      }
LAB_003b2f7d:
      std::__cxx11::string::~string((string *)&inputFile);
      std::__cxx11::string::~string((string *)&absFile);
    }
    for (; psVar7 != newRccFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; psVar7 = psVar7 + 1) {
      cmGeneratorTarget::AddSource(target,psVar7);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&newRccFiles);
    std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
              (&srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
  }
  else {
    std::__cxx11::string::string((string *)&inputFile,"AUTOUIC",(allocator *)&perm);
    bVar3 = cmGeneratorTarget::GetPropertyAsBool(target,&inputFile);
    if (bVar3) {
      std::__cxx11::string::~string((string *)&inputFile);
      goto LAB_003b2c3d;
    }
    std::__cxx11::string::string
              ((string *)&outputFile,"AUTORCC",(allocator *)&config_moc_compile_defs);
    bVar3 = cmGeneratorTarget::GetPropertyAsBool(target,&outputFile);
    std::__cxx11::string::~string((string *)&outputFile);
    std::__cxx11::string::~string((string *)&inputFile);
    std::__cxx11::string::~string((string *)&absFile);
    if (bVar3) goto LAB_003b2c4a;
  }
  std::__cxx11::string::string((string *)&absFile,"_cpp_files",(allocator *)&rcc_output_dir);
  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&outputFile,&mocSources,";");
  cmOutputConverter::EscapeForCMake(&inputFile,&outputFile);
  cmMakefile::AddDefinition(this,&absFile,inputFile._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&inputFile);
  std::__cxx11::string::~string((string *)&outputFile);
  std::__cxx11::string::~string((string *)&absFile);
  std::__cxx11::string::string((string *)&absFile,"AUTOMOC",(allocator *)&inputFile);
  bVar3 = cmGeneratorTarget::GetPropertyAsBool(target,&absFile);
  std::__cxx11::string::~string((string *)&absFile);
  if (bVar3) {
    pcVar10 = cmGeneratorTarget::GetLocalGenerator(target);
    pcVar1 = target->Target->Makefile;
    std::__cxx11::string::string((string *)&absFile,"AUTOMOC_MOC_OPTIONS",(allocator *)&inputFile);
    pcVar9 = cmGeneratorTarget::GetProperty(target,&absFile);
    std::__cxx11::string::~string((string *)&absFile);
    pcVar8 = "";
    if (pcVar9 != (char *)0x0) {
      pcVar8 = pcVar9;
    }
    std::__cxx11::string::string((string *)&absFile,pcVar8,(allocator *)&inputFile);
    std::__cxx11::string::string((string *)&inputFile,"_moc_options",(allocator *)&rcc_output_dir);
    cmOutputConverter::EscapeForCMake(&outputFile,&absFile);
    cmMakefile::AddDefinition(pcVar1,&inputFile,outputFile._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&outputFile);
    std::__cxx11::string::~string((string *)&inputFile);
    std::__cxx11::string::string((string *)&inputFile,"_skip_moc",(allocator *)&perm);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&rcc_output_dir,&skipMoc,";");
    cmOutputConverter::EscapeForCMake(&outputFile,&rcc_output_dir);
    cmMakefile::AddDefinition(pcVar1,&inputFile,outputFile._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&outputFile);
    std::__cxx11::string::~string((string *)&rcc_output_dir);
    std::__cxx11::string::~string((string *)&inputFile);
    std::__cxx11::string::string((string *)&inputFile,"_moc_headers",(allocator *)&perm);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&rcc_output_dir,&mocHeaders,";");
    cmOutputConverter::EscapeForCMake(&outputFile,&rcc_output_dir);
    cmMakefile::AddDefinition(pcVar1,&inputFile,outputFile._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&outputFile);
    std::__cxx11::string::~string((string *)&rcc_output_dir);
    std::__cxx11::string::~string((string *)&inputFile);
    std::__cxx11::string::string
              ((string *)&inputFile,"CMAKE_AUTOMOC_RELAXED_MODE",(allocator *)&outputFile);
    bVar3 = cmMakefile::IsOn(pcVar1,&inputFile);
    std::__cxx11::string::~string((string *)&inputFile);
    std::__cxx11::string::string((string *)&inputFile,"_moc_relaxed_mode",(allocator *)&outputFile);
    pcVar8 = "FALSE";
    if (bVar3) {
      pcVar8 = "TRUE";
    }
    cmMakefile::AddDefinition(pcVar1,&inputFile,pcVar8);
    std::__cxx11::string::~string((string *)&inputFile);
    inputFile._M_dataplus._M_p = (pointer)&inputFile.field_2;
    inputFile._M_string_length = 0;
    outputFile._M_dataplus._M_p = (pointer)&outputFile.field_2;
    outputFile._M_string_length = 0;
    inputFile.field_2._M_local_buf[0] = '\0';
    outputFile.field_2._M_local_buf[0] = '\0';
    srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmMakefile::GetConfigurations
              (&rcc_output_dir,pcVar1,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&srcFiles,true);
    GetCompileDefinitionsAndDirectories(target,&rcc_output_dir,&inputFile,&outputFile);
    std::__cxx11::string::string((string *)&perm,"_moc_incs",(allocator *)&opts);
    cmOutputConverter::EscapeForCMake(&config_moc_compile_defs,&inputFile);
    cmMakefile::AddDefinition(pcVar1,(string *)&perm,config_moc_compile_defs._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&config_moc_compile_defs);
    std::__cxx11::string::~string((string *)&perm);
    std::__cxx11::string::string((string *)&perm,"_moc_compile_defs",(allocator *)&opts);
    cmOutputConverter::EscapeForCMake(&config_moc_compile_defs,&outputFile);
    cmMakefile::AddDefinition(pcVar1,(string *)&perm,config_moc_compile_defs._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&config_moc_compile_defs);
    std::__cxx11::string::~string((string *)&perm);
    for (psVar7 = (string *)
                  srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        psVar7 != (string *)
                  srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish; psVar7 = psVar7 + 1) {
      _perm = (pointer)&local_4b8;
      local_4c0 = 0;
      local_4b8._M_local_buf[0] = '\0';
      config_moc_compile_defs._M_dataplus._M_p = (pointer)&config_moc_compile_defs.field_2;
      config_moc_compile_defs._M_string_length = 0;
      config_moc_compile_defs.field_2._M_local_buf[0] = '\0';
      GetCompileDefinitionsAndDirectories
                (target,psVar7,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&perm,
                 &config_moc_compile_defs);
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &perm,&inputFile);
      if (bVar3) {
        cmOutputConverter::EscapeForCMake
                  (&opts,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&perm)
        ;
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&configIncludes,psVar7);
        std::__cxx11::string::operator=((string *)pmVar11,(string *)&opts);
        std::__cxx11::string::~string((string *)&opts);
        if (inputFile._M_string_length == 0) {
          std::__cxx11::string::_M_assign((string *)&inputFile);
        }
      }
      bVar3 = std::operator!=(&config_moc_compile_defs,&outputFile);
      if (bVar3) {
        cmOutputConverter::EscapeForCMake(&opts,&config_moc_compile_defs);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&configDefines,psVar7);
        std::__cxx11::string::operator=((string *)pmVar11,(string *)&opts);
        std::__cxx11::string::~string((string *)&opts);
        if (outputFile._M_string_length == 0) {
          std::__cxx11::string::_M_assign((string *)&outputFile);
        }
      }
      std::__cxx11::string::~string((string *)&config_moc_compile_defs);
      std::__cxx11::string::~string((string *)&perm);
    }
    std::__cxx11::string::string
              ((string *)&perm,"_target_qt_version",(allocator *)&config_moc_compile_defs);
    pcVar8 = cmMakefile::GetDefinition(pcVar1,(string *)&perm);
    std::__cxx11::string::~string((string *)&perm);
    if (*pcVar8 == '4') {
      if (pcVar8[1] != '\0') goto LAB_003b3691;
      std::__cxx11::string::string((string *)&perm,"Qt4::moc",(allocator *)&config_moc_compile_defs)
      ;
      pcVar12 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar10,(string *)&perm);
      std::__cxx11::string::~string((string *)&perm);
      if (pcVar12 != (cmGeneratorTarget *)0x0) {
        std::__cxx11::string::string((string *)&perm,"_qt_moc_executable",(allocator *)&opts);
        std::__cxx11::string::string
                  ((string *)&config_moc_compile_defs,"",(allocator *)&newRccFiles);
        pcVar8 = cmGeneratorTarget::ImportedGetLocation(pcVar12,&config_moc_compile_defs);
        cmMakefile::AddDefinition(pcVar1,(string *)&perm,pcVar8);
        goto LAB_003b4ac7;
      }
      cmSystemTools::Error
                ("Qt4::moc target not found ",autogenTargetName._M_dataplus._M_p,(char *)0x0,
                 (char *)0x0);
    }
    else if ((*pcVar8 == '5') && (pcVar8[1] == '\0')) {
      std::__cxx11::string::string((string *)&perm,"Qt5::moc",(allocator *)&config_moc_compile_defs)
      ;
      pcVar12 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar10,(string *)&perm);
      std::__cxx11::string::~string((string *)&perm);
      if (pcVar12 == (cmGeneratorTarget *)0x0) {
        cmSystemTools::Error
                  ("Qt5::moc target not found ",autogenTargetName._M_dataplus._M_p,(char *)0x0,
                   (char *)0x0);
      }
      else {
        std::__cxx11::string::string((string *)&perm,"_qt_moc_executable",(allocator *)&opts);
        std::__cxx11::string::string
                  ((string *)&config_moc_compile_defs,"",(allocator *)&newRccFiles);
        pcVar8 = cmGeneratorTarget::ImportedGetLocation(pcVar12,&config_moc_compile_defs);
        cmMakefile::AddDefinition(pcVar1,(string *)&perm,pcVar8);
LAB_003b4ac7:
        std::__cxx11::string::~string((string *)&config_moc_compile_defs);
        std::__cxx11::string::~string((string *)&perm);
      }
    }
    else {
LAB_003b3691:
      cmSystemTools::Error
                ("The CMAKE_AUTOMOC feature supports only Qt 4 and Qt 5 ",
                 autogenTargetName._M_dataplus._M_p,(char *)0x0,(char *)0x0);
    }
    std::__cxx11::string::~string((string *)&rcc_output_dir);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&srcFiles);
    std::__cxx11::string::~string((string *)&outputFile);
    std::__cxx11::string::~string((string *)&inputFile);
    std::__cxx11::string::~string((string *)&absFile);
  }
  std::__cxx11::string::string((string *)&absFile,"AUTOUIC",(allocator *)&inputFile);
  bVar3 = cmGeneratorTarget::GetPropertyAsBool(target,&absFile);
  std::__cxx11::string::~string((string *)&absFile);
  if (!bVar3) goto LAB_003b3cfe;
  pcVar10 = cmGeneratorTarget::GetLocalGenerator(target);
  pcVar1 = target->Target->Makefile;
  absFile.field_2._8_8_ = &absFile._M_string_length;
  absFile._M_string_length = absFile._M_string_length & 0xffffffff00000000;
  absFile.field_2._M_allocated_capacity = 0;
  local_300 = 0;
  local_308 = (size_type *)absFile.field_2._8_8_;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::
  _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&absFile,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )skipUic.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )skipUic.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::string((string *)&inputFile,"_skip_uic",(allocator *)&perm);
  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&rcc_output_dir,&skipUic,";");
  cmOutputConverter::EscapeForCMake(&outputFile,&rcc_output_dir);
  cmMakefile::AddDefinition(pcVar1,&inputFile,outputFile._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&outputFile);
  std::__cxx11::string::~string((string *)&rcc_output_dir);
  std::__cxx11::string::~string((string *)&inputFile);
  cmMakefile::GetQtUiFilesWithOptions
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&newRccFiles,pcVar1);
  std::__cxx11::string::string((string *)&inputFile,"_target_qt_version",(allocator *)&outputFile);
  pcVar8 = cmMakefile::GetDefinition(pcVar1,&inputFile);
  std::__cxx11::string::~string((string *)&inputFile);
  inputFile._M_dataplus._M_p = (pointer)&inputFile.field_2;
  inputFile._M_string_length = 0;
  inputFile.field_2._M_local_buf[0] = '\0';
  configs_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configs_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  configs_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&outputFile,pcVar1,&configs_1,true);
  GetUicOpts(target,&outputFile,&inputFile);
  if (inputFile._M_string_length != 0) {
    cmOutputConverter::EscapeForCMake(&rcc_output_dir,&inputFile);
    std::__cxx11::string::operator=((string *)&inputFile,(string *)&rcc_output_dir);
    std::__cxx11::string::~string((string *)&rcc_output_dir);
    std::__cxx11::string::string((string *)&rcc_output_dir,"_uic_target_options",(allocator *)&perm)
    ;
    cmMakefile::AddDefinition(pcVar1,&rcc_output_dir,inputFile._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&rcc_output_dir);
  }
  for (pbVar17 = configs_1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      rcc_output_dir._M_dataplus._M_p = (pointer)&rcc_output_dir.field_2,
      pbVar17 !=
      configs_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar17 = pbVar17 + 1) {
    rcc_output_dir._M_string_length = 0;
    rcc_output_dir.field_2._M_local_buf[0] = '\0';
    GetUicOpts(target,pbVar17,&rcc_output_dir);
    bVar3 = std::operator!=(&rcc_output_dir,&inputFile);
    if (bVar3) {
      cmOutputConverter::EscapeForCMake((string *)&perm,&rcc_output_dir);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&configUicOptions,pbVar17);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&perm);
      std::__cxx11::string::~string((string *)&perm);
      if (inputFile._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&inputFile);
      }
    }
    std::__cxx11::string::~string((string *)&rcc_output_dir);
  }
  rcc_output_dir._M_string_length = 0;
  _perm = (pointer)&local_4b8;
  local_4c0 = 0;
  rcc_output_dir.field_2._M_local_buf[0] = '\0';
  local_4b8._M_local_buf[0] = '\0';
  for (pbVar17 = newRccFiles.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar17 !=
      newRccFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar17 = (pointer)&pbVar17->_M_string_length) {
    pcVar2 = (cmSourceFile *)(pbVar17->_M_dataplus)._M_p;
    psVar7 = cmSourceFile::GetFullPath(pcVar2,(string *)0x0);
    cmsys::SystemTools::GetRealPath(&config_moc_compile_defs,psVar7,(string *)0x0);
    pVar20 = std::
             _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
             ::_M_insert_unique<std::__cxx11::string_const&>
                       ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)&absFile,&config_moc_compile_defs);
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::__cxx11::string::append((char *)&rcc_output_dir);
      std::__cxx11::string::append((string *)&rcc_output_dir);
      std::__cxx11::string::append((char *)&perm);
      std::__cxx11::string::string((string *)&srcFiles,"AUTOUIC_OPTIONS",(allocator *)&rccOptions);
      pcVar9 = cmSourceFile::GetProperty(pcVar2,(string *)&srcFiles);
      std::__cxx11::string::string((string *)&opts,pcVar9,(allocator *)&depends);
      std::__cxx11::string::~string((string *)&srcFiles);
      cmsys::SystemTools::ReplaceString(&opts,";","@list_sep@");
      std::__cxx11::string::append((string *)&perm);
      std::__cxx11::string::~string((string *)&opts);
    }
    std::__cxx11::string::~string((string *)&config_moc_compile_defs);
  }
  std::__cxx11::string::string
            ((string *)&config_moc_compile_defs,"_qt_uic_options_files",(allocator *)&srcFiles);
  cmOutputConverter::EscapeForCMake(&opts,&rcc_output_dir);
  cmMakefile::AddDefinition(pcVar1,&config_moc_compile_defs,opts._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&opts);
  std::__cxx11::string::~string((string *)&config_moc_compile_defs);
  std::__cxx11::string::string
            ((string *)&config_moc_compile_defs,"_qt_uic_options_options",(allocator *)&srcFiles);
  cmOutputConverter::EscapeForCMake(&opts,(string *)&perm);
  cmMakefile::AddDefinition(pcVar1,&config_moc_compile_defs,opts._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&opts);
  std::__cxx11::string::~string((string *)&config_moc_compile_defs);
  psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  std::__cxx11::string::string((string *)&config_moc_compile_defs,(string *)psVar7);
  if (*pcVar8 == '4') {
    if (pcVar8[1] != '\0') goto LAB_003b3c87;
    std::__cxx11::string::string((string *)&opts,"Qt4::uic",(allocator *)&srcFiles);
    pcVar12 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar10,&opts);
    std::__cxx11::string::~string((string *)&opts);
    if (pcVar12 != (cmGeneratorTarget *)0x0) {
      std::__cxx11::string::string((string *)&opts,"_qt_uic_executable",(allocator *)&rccOptions);
      std::__cxx11::string::string((string *)&srcFiles,"",(allocator *)&depends);
      pcVar8 = cmGeneratorTarget::ImportedGetLocation(pcVar12,(string *)&srcFiles);
      cmMakefile::AddDefinition(pcVar1,&opts,pcVar8);
      goto LAB_003b4b79;
    }
    cmSystemTools::Error
              ("Qt4::uic target not found ",config_moc_compile_defs._M_dataplus._M_p,(char *)0x0,
               (char *)0x0);
  }
  else if ((*pcVar8 == '5') && (pcVar8[1] == '\0')) {
    std::__cxx11::string::string((string *)&opts,"Qt5::uic",(allocator *)&srcFiles);
    pcVar12 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar10,&opts);
    std::__cxx11::string::~string((string *)&opts);
    if (pcVar12 != (cmGeneratorTarget *)0x0) {
      std::__cxx11::string::string((string *)&opts,"_qt_uic_executable",(allocator *)&rccOptions);
      std::__cxx11::string::string((string *)&srcFiles,"",(allocator *)&depends);
      pcVar8 = cmGeneratorTarget::ImportedGetLocation(pcVar12,(string *)&srcFiles);
      cmMakefile::AddDefinition(pcVar1,&opts,pcVar8);
LAB_003b4b79:
      std::__cxx11::string::~string((string *)&srcFiles);
      std::__cxx11::string::~string((string *)&opts);
    }
  }
  else {
LAB_003b3c87:
    cmSystemTools::Error
              ("The CMAKE_AUTOUIC feature supports only Qt 4 and Qt 5 ",
               config_moc_compile_defs._M_dataplus._M_p,(char *)0x0,(char *)0x0);
  }
  std::__cxx11::string::~string((string *)&config_moc_compile_defs);
  std::__cxx11::string::~string((string *)&perm);
  std::__cxx11::string::~string((string *)&rcc_output_dir);
  std::__cxx11::string::~string((string *)&outputFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configs_1);
  std::__cxx11::string::~string((string *)&inputFile);
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            ((_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&newRccFiles);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&absFile);
LAB_003b3cfe:
  std::__cxx11::string::string((string *)&absFile,"AUTORCC",(allocator *)&inputFile);
  bVar3 = cmGeneratorTarget::GetPropertyAsBool(target,&absFile);
  std::__cxx11::string::~string((string *)&absFile);
  if (bVar3) {
    inputFile._M_dataplus._M_p = (pointer)&inputFile.field_2;
    inputFile._M_string_length = 0;
    inputFile.field_2._M_local_buf[0] = '\0';
    pcVar1 = target->Target->Makefile;
    configs_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    configs_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    configs_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmGeneratorTarget::GetConfigCommonSourceFiles
              (target,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&configs_1);
    outputFile._M_dataplus._M_p = (pointer)&outputFile.field_2;
    outputFile._M_string_length = 0;
    rcc_output_dir._M_dataplus._M_p = (pointer)&rcc_output_dir.field_2;
    rcc_output_dir._M_string_length = 0;
    outputFile.field_2._M_local_buf[0] = '\0';
    rcc_output_dir.field_2._M_local_buf[0] = '\0';
    _perm = (pointer)&local_4b8;
    local_4c0 = 0;
    local_4b8._M_local_buf[0] = '\0';
    std::__cxx11::string::string
              ((string *)&absFile,"_target_qt_version",(allocator *)&config_moc_compile_defs);
    cmMakefile::GetDefinition(pcVar1,&absFile);
    std::__cxx11::string::~string((string *)&absFile);
    rccOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    rccOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    rccOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string
              ((string *)&absFile,"AUTORCC_OPTIONS",(allocator *)&config_moc_compile_defs);
    pcVar8 = cmGeneratorTarget::GetProperty(target,&absFile);
    std::__cxx11::string::~string((string *)&absFile);
    if (pcVar8 != (char *)0x0) {
      std::__cxx11::string::string((string *)&absFile,pcVar8,(allocator *)&config_moc_compile_defs);
      cmSystemTools::ExpandListArgument(&absFile,&rccOptions,false);
      std::__cxx11::string::~string((string *)&absFile);
    }
    std::__cxx11::string::string((string *)&absFile,"QT_VERSION_MAJOR",(allocator *)&opts);
    pcVar8 = cmMakefile::GetSafeDefinition(pcVar1,&absFile);
    std::__cxx11::string::string((string *)&config_moc_compile_defs,pcVar8,(allocator *)&srcFiles);
    std::__cxx11::string::~string((string *)&absFile);
    bVar3 = std::operator==(&config_moc_compile_defs,"");
    if (bVar3) {
      std::__cxx11::string::string((string *)&absFile,"Qt5Core_VERSION_MAJOR",(allocator *)&opts);
      cmMakefile::GetSafeDefinition(pcVar1,&absFile);
      std::__cxx11::string::assign((char *)&config_moc_compile_defs);
      std::__cxx11::string::~string((string *)&absFile);
    }
    pbVar17 = configs_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pbVar17 ==
          configs_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        std::operator+(&absFile,"_qt_rcc_inputs_",psVar7);
        cmOutputConverter::EscapeForCMake(&opts,&outputFile);
        cmMakefile::AddDefinition(pcVar1,&absFile,opts._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&opts);
        std::__cxx11::string::~string((string *)&absFile);
        std::__cxx11::string::string((string *)&absFile,"_rcc_files",(allocator *)&srcFiles);
        cmOutputConverter::EscapeForCMake(&opts,&inputFile);
        cmMakefile::AddDefinition(pcVar1,&absFile,opts._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&opts);
        std::__cxx11::string::~string((string *)&absFile);
        std::__cxx11::string::string
                  ((string *)&absFile,"_qt_rcc_options_files",(allocator *)&srcFiles);
        cmOutputConverter::EscapeForCMake(&opts,&rcc_output_dir);
        cmMakefile::AddDefinition(pcVar1,&absFile,opts._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&opts);
        std::__cxx11::string::~string((string *)&absFile);
        std::__cxx11::string::string
                  ((string *)&absFile,"_qt_rcc_options_options",(allocator *)&srcFiles);
        cmOutputConverter::EscapeForCMake(&opts,(string *)&perm);
        cmMakefile::AddDefinition(pcVar1,&absFile,opts._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&opts);
        std::__cxx11::string::~string((string *)&absFile);
        std::__cxx11::string::string((string *)&absFile,"_qt_rcc_executable",(allocator *)&srcFiles)
        ;
        GetRccExecutable_abi_cxx11_(&opts,target);
        cmMakefile::AddDefinition(pcVar1,&absFile,opts._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&opts);
        std::__cxx11::string::~string((string *)&absFile);
        break;
      }
      pcVar2 = (cmSourceFile *)(pbVar17->_M_dataplus)._M_p;
      psVar7 = cmSourceFile::GetExtension_abi_cxx11_(pcVar2);
      std::__cxx11::string::string((string *)&opts,(string *)psVar7);
      bVar4 = std::operator==(&opts,"qrc");
      bVar3 = true;
      if (bVar4) {
        psVar7 = cmSourceFile::GetFullPath(pcVar2,(string *)0x0);
        cmsys::SystemTools::GetRealPath((string *)&srcFiles,psVar7,(string *)0x0);
        std::__cxx11::string::string((string *)&absFile,"SKIP_AUTORCC",(allocator *)&newRccFiles);
        pcVar8 = cmSourceFile::GetPropertyForUser(pcVar2,&absFile);
        bVar4 = cmSystemTools::IsOn(pcVar8);
        std::__cxx11::string::~string((string *)&absFile);
        bVar3 = true;
        if (!bVar4) {
          std::__cxx11::string::append((char *)&inputFile);
          std::__cxx11::string::append((string *)&inputFile);
          std::__cxx11::string::string
                    ((string *)&absFile,"AUTORCC_OPTIONS",(allocator *)&newRccFiles);
          pcVar8 = cmSourceFile::GetProperty(pcVar2,&absFile);
          std::__cxx11::string::~string((string *)&absFile);
          if (pcVar8 != (char *)0x0) {
            depends.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            depends.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            depends.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::__cxx11::string::string((string *)&absFile,pcVar8,(allocator *)&newRccFiles);
            cmSystemTools::ExpandListArgument(&absFile,&depends,false);
            std::__cxx11::string::~string((string *)&absFile);
            newRccFiles.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            newRccFiles.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            newRccFiles.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            for (pbVar18 = depends.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                pbVar18 !=
                depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar18 = pbVar18 + 1) {
              _Var13 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                 (rccOptions.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  rccOptions.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,pbVar18);
              if (_Var13._M_current ==
                  rccOptions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&newRccFiles,pbVar18);
              }
              else {
                std::__cxx11::string::string((string *)&absFile,(string *)pbVar18);
                ppcVar14 = std::find_if<char_const*const*,cmStrCmp>
                                     ((char **)MergeRccOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                                               ::valueOptions,(char **)Convert::DaysInMonth,
                                      (cmStrCmp *)&absFile);
                std::__cxx11::string::~string((string *)&absFile);
                if (ppcVar14 != (char **)Convert::DaysInMonth) {
                  if (_Var13._M_current + 1 ==
                      rccOptions.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    __assert_fail("existingIt + 1 != opts.end()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmQtAutoGeneratorInitializer.cxx"
                                  ,0x1a7,
                                  "void MergeRccOptions(std::vector<std::string> &, const std::vector<std::string> &, bool)"
                                 );
                  }
                  pbVar18 = pbVar18 + 1;
                  std::__cxx11::string::_M_assign((string *)(_Var13._M_current + 1));
                }
              }
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &rccOptions,
                       (const_iterator)
                       rccOptions.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )newRccFiles.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )newRccFiles.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&newRccFiles);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&depends);
          }
          pbVar18 = rccOptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (rccOptions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              rccOptions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::__cxx11::string::append((char *)&rcc_output_dir);
            std::__cxx11::string::append((string *)&rcc_output_dir);
            std::__cxx11::string::append((char *)&perm);
            pbVar18 = rccOptions.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          for (; pbVar18 !=
                 rccOptions.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; pbVar18 = pbVar18 + 1) {
            std::__cxx11::string::append((char *)&perm);
            std::__cxx11::string::append((string *)&perm);
          }
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          absFile._M_dataplus._M_p = (pointer)&absFile.field_2;
          absFile._M_string_length = 0;
          absFile.field_2._M_allocated_capacity =
               absFile.field_2._M_allocated_capacity & 0xffffffffffffff00;
          std::__cxx11::string::string((string *)&newRccFiles,"GENERATED",&local_409);
          pcVar8 = cmSourceFile::GetPropertyForUser(pcVar2,(string *)&newRccFiles);
          bVar3 = cmSystemTools::IsOn(pcVar8);
          std::__cxx11::string::~string((string *)&newRccFiles);
          if (bVar3) {
LAB_003b431e:
            std::__cxx11::string::append((char *)&outputFile);
            bVar3 = true;
            std::__cxx11::string::append((string *)&outputFile);
          }
          else {
            bVar3 = std::operator==(&config_moc_compile_defs,"5");
            if (bVar3) {
              ListQt5RccInputs((string *)&newRccFiles,pcVar2,target,&depends);
            }
            else {
              ListQt4RccInputs((string *)&newRccFiles,pcVar2,&depends);
            }
            std::__cxx11::string::operator=((string *)&absFile,(string *)&newRccFiles);
            std::__cxx11::string::~string((string *)&newRccFiles);
            if (absFile._M_string_length != 0) goto LAB_003b431e;
            bVar3 = false;
          }
          std::__cxx11::string::~string((string *)&absFile);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&depends);
        }
        std::__cxx11::string::~string((string *)&srcFiles);
      }
      std::__cxx11::string::~string((string *)&opts);
      pbVar17 = (pointer)&pbVar17->_M_string_length;
    } while (bVar3);
    std::__cxx11::string::~string((string *)&config_moc_compile_defs);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&rccOptions);
    std::__cxx11::string::~string((string *)&perm);
    std::__cxx11::string::~string((string *)&rcc_output_dir);
    std::__cxx11::string::~string((string *)&outputFile);
    std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
              ((_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&configs_1);
    std::__cxx11::string::~string((string *)&inputFile);
  }
  std::__cxx11::string::string((string *)&absFile,"CMAKE_ROOT",(allocator *)&inputFile);
  pcVar8 = cmMakefile::GetSafeDefinition(this,&absFile);
  std::__cxx11::string::~string((string *)&absFile);
  std::__cxx11::string::string((string *)&inputFile,pcVar8,(allocator *)&absFile);
  std::__cxx11::string::append((char *)&inputFile);
  std::__cxx11::string::string((string *)&outputFile,(string *)&targetDir);
  std::__cxx11::string::append((char *)&outputFile);
  std::__cxx11::string::string((string *)&absFile,"_qt_rcc_inputs",(allocator *)&perm);
  psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  std::operator+(&rcc_output_dir,"_qt_rcc_inputs_",psVar7);
  pcVar8 = cmMakefile::GetDefinition(this,&rcc_output_dir);
  cmMakefile::AddDefinition(this,&absFile,pcVar8);
  std::__cxx11::string::~string((string *)&rcc_output_dir);
  std::__cxx11::string::~string((string *)&absFile);
  outfile = outputFile._M_dataplus;
  infile = inputFile._M_dataplus;
  cmNewLineStyle::cmNewLineStyle((cmNewLineStyle *)&absFile);
  cmMakefile::ConfigureFile
            (this,infile._M_p,outfile._M_p,false,true,false,(cmNewLineStyle *)&absFile);
  _perm = _perm & 0xffffffff00000000;
  cmsys::SystemTools::GetPermissions(&outputFile,&perm);
  if (-1 < (char)_perm) {
    cmsys::SystemTools::SetPermissions(&outputFile,perm | 0x80,false);
  }
  if (((configDefines._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) ||
      (configIncludes._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) ||
     (configUicOptions._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    std::ofstream::ofstream(&absFile,outputFile._M_dataplus._M_p,_S_app);
    if ((*(byte *)((long)&local_308 + *(long *)(absFile._M_dataplus._M_p + -0x18)) & 5) == 0) {
      if (configDefines._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        for (p_Var16 = configDefines._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var16 != &configDefines._M_t._M_impl.super__Rb_tree_header;
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
          poVar15 = std::operator<<((ostream *)&absFile,"set(AM_MOC_COMPILE_DEFINITIONS_");
          poVar15 = std::operator<<(poVar15,(string *)(p_Var16 + 1));
          poVar15 = std::operator<<(poVar15," ");
          poVar15 = std::operator<<(poVar15,(string *)(p_Var16 + 2));
          std::operator<<(poVar15,")\n");
        }
      }
      if (configIncludes._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        for (p_Var16 = configIncludes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var16 != &configIncludes._M_t._M_impl.super__Rb_tree_header;
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
          poVar15 = std::operator<<((ostream *)&absFile,"set(AM_MOC_INCLUDES_");
          poVar15 = std::operator<<(poVar15,(string *)(p_Var16 + 1));
          poVar15 = std::operator<<(poVar15," ");
          poVar15 = std::operator<<(poVar15,(string *)(p_Var16 + 2));
          std::operator<<(poVar15,")\n");
        }
      }
      if (configUicOptions._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        for (p_Var16 = configUicOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var16 != &configUicOptions._M_t._M_impl.super__Rb_tree_header;
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
          poVar15 = std::operator<<((ostream *)&absFile,"set(AM_UIC_TARGET_OPTIONS_");
          poVar15 = std::operator<<(poVar15,(string *)(p_Var16 + 1));
          poVar15 = std::operator<<(poVar15," ");
          poVar15 = std::operator<<(poVar15,(string *)(p_Var16 + 2));
          std::operator<<(poVar15,")\n");
        }
      }
    }
    else {
      std::__cxx11::string::string
                ((string *)&rcc_output_dir,"Internal CMake error when trying to open file: ",
                 (allocator *)&config_moc_compile_defs);
      std::__cxx11::string::append((char *)&rcc_output_dir);
      std::__cxx11::string::append((char *)&rcc_output_dir);
      cmSystemTools::Error(rcc_output_dir._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)&rcc_output_dir);
    }
    std::ofstream::~ofstream(&absFile);
  }
  std::__cxx11::string::~string((string *)&outputFile);
  std::__cxx11::string::~string((string *)&inputFile);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&configUicOptions._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&configDefines._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&configIncludes._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&mocHeaders);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&mocSources);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&skipMoc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&skipUic);
  std::__cxx11::string::~string((string *)&targetDir);
  std::__cxx11::string::~string((string *)&autogenTargetName);
  cmMakefile::ScopePushPop::~ScopePushPop(&varScope);
  return;
}

Assistant:

void cmQtAutoGeneratorInitializer::SetupAutoGenerateTarget(
    cmGeneratorTarget const* target)
{
  cmMakefile* makefile = target->Target->GetMakefile();

  // forget the variables added here afterwards again:
  cmMakefile::ScopePushPop varScope(makefile);
  static_cast<void>(varScope);

  // create a custom target for running generators at buildtime:
  std::string autogenTargetName = GetAutogenTargetName(target);

  makefile->AddDefinition("_moc_target_name",
          cmOutputConverter::EscapeForCMake(autogenTargetName).c_str());
  makefile->AddDefinition("_origin_target_name",
          cmOutputConverter::EscapeForCMake(target->GetName()).c_str());

  std::string targetDir = GetAutogenTargetDir(target);

  const char *qtVersion = makefile->GetDefinition("Qt5Core_VERSION_MAJOR");
  if (!qtVersion)
    {
    qtVersion = makefile->GetDefinition("QT_VERSION_MAJOR");
    }
  if (const char *targetQtVersion =
      target->GetLinkInterfaceDependentStringProperty("QT_MAJOR_VERSION", ""))
    {
    qtVersion = targetQtVersion;
    }
  if (qtVersion)
    {
    makefile->AddDefinition("_target_qt_version", qtVersion);
    }

  std::vector<std::string> skipUic;
  std::vector<std::string> skipMoc;
  std::vector<std::string> mocSources;
  std::vector<std::string> mocHeaders;
  std::map<std::string, std::string> configIncludes;
  std::map<std::string, std::string> configDefines;
  std::map<std::string, std::string> configUicOptions;

  if (target->GetPropertyAsBool("AUTOMOC")
      || target->GetPropertyAsBool("AUTOUIC")
      || target->GetPropertyAsBool("AUTORCC"))
    {
    SetupSourceFiles(target, skipMoc, mocSources, mocHeaders, skipUic);
    }
  makefile->AddDefinition("_cpp_files",
          cmOutputConverter::EscapeForCMake(cmJoin(mocSources, ";")).c_str());
  if (target->GetPropertyAsBool("AUTOMOC"))
    {
    SetupAutoMocTarget(target, autogenTargetName,
                             skipMoc, mocHeaders,
                             configIncludes, configDefines);
    }
  if (target->GetPropertyAsBool("AUTOUIC"))
    {
    SetupAutoUicTarget(target, skipUic, configUicOptions);
    }
  if (target->GetPropertyAsBool("AUTORCC"))
    {
    SetupAutoRccTarget(target);
    }

  const char* cmakeRoot = makefile->GetSafeDefinition("CMAKE_ROOT");
  std::string inputFile = cmakeRoot;
  inputFile += "/Modules/AutogenInfo.cmake.in";
  std::string outputFile = targetDir;
  outputFile += "/AutogenInfo.cmake";
  makefile->AddDefinition("_qt_rcc_inputs",
              makefile->GetDefinition("_qt_rcc_inputs_" + target->GetName()));
  makefile->ConfigureFile(inputFile.c_str(), outputFile.c_str(),
                          false, true, false);

  // Ensure we have write permission in case .in was read-only.
  mode_t perm = 0;
#if defined(_WIN32) && !defined(__CYGWIN__)
  mode_t mode_write = S_IWRITE;
#else
  mode_t mode_write = S_IWUSR;
#endif
  cmSystemTools::GetPermissions(outputFile, perm);
  if (!(perm & mode_write))
    {
    cmSystemTools::SetPermissions(outputFile, perm | mode_write);
    }
  if (!configDefines.empty()
      || !configIncludes.empty()
      || !configUicOptions.empty())
    {
    cmsys::ofstream infoFile(outputFile.c_str(), std::ios::app);
    if ( !infoFile )
      {
      std::string error = "Internal CMake error when trying to open file: ";
      error += outputFile.c_str();
      error += " for writing.";
      cmSystemTools::Error(error.c_str());
      return;
      }
    if (!configDefines.empty())
      {
      for (std::map<std::string, std::string>::iterator
            it = configDefines.begin(), end = configDefines.end();
            it != end; ++it)
        {
        infoFile << "set(AM_MOC_COMPILE_DEFINITIONS_" << it->first <<
          " " << it->second << ")\n";
        }
      }
    if (!configIncludes.empty())
      {
      for (std::map<std::string, std::string>::iterator
            it = configIncludes.begin(), end = configIncludes.end();
            it != end; ++it)
        {
        infoFile << "set(AM_MOC_INCLUDES_" << it->first <<
          " " << it->second << ")\n";
        }
      }
    if (!configUicOptions.empty())
      {
      for (std::map<std::string, std::string>::iterator
            it = configUicOptions.begin(), end = configUicOptions.end();
            it != end; ++it)
        {
        infoFile << "set(AM_UIC_TARGET_OPTIONS_" << it->first <<
          " " << it->second << ")\n";
        }
      }
    }
}